

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCanBeNull(Expr *p)

{
  uint uVar1;
  bool bVar2;
  bool local_22;
  bool local_21;
  byte local_19;
  Expr *pEStack_18;
  u8 op;
  Expr *p_local;
  
  pEStack_18 = p;
  while( true ) {
    bVar2 = true;
    if (pEStack_18->op != 0xa6) {
      bVar2 = pEStack_18->op == 0xa5;
    }
    if (!bVar2) break;
    pEStack_18 = pEStack_18->pLeft;
  }
  local_19 = pEStack_18->op;
  if (local_19 == 0xa8) {
    local_19 = pEStack_18->op2;
  }
  uVar1 = (uint)local_19;
  if ((uVar1 == 0x6e) || (uVar1 - 0x91 < 3)) {
    p_local._4_4_ = 0;
  }
  else if (uVar1 == 0xa2) {
    local_21 = true;
    if (((pEStack_18->flags & 0x100000) == 0) &&
       (local_21 = true, (pEStack_18->y).pTab != (Table *)0x0)) {
      local_22 = false;
      if (-1 < pEStack_18->iColumn) {
        local_22 = ((pEStack_18->y).pTab)->aCol[pEStack_18->iColumn].notNull == '\0';
      }
      local_21 = local_22;
    }
    p_local._4_4_ = (uint)local_21;
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCanBeNull(const Expr *p){
  u8 op;
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){
    p = p->pLeft;
  }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER:
    case TK_STRING:
    case TK_FLOAT:
    case TK_BLOB:
      return 0;
    case TK_COLUMN:
      return ExprHasProperty(p, EP_CanBeNull) ||
             p->y.pTab==0 ||  /* Reference to column of index on expression */
             (p->iColumn>=0 && p->y.pTab->aCol[p->iColumn].notNull==0);
    default:
      return 1;
  }
}